

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall
QApplicationPrivate::sendSyntheticEnterLeave(QApplicationPrivate *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  QWidgetPrivate *pos_00;
  QPointingDevice *pQVar6;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QWidget *widgetUnderCursor;
  QWidget *tlw;
  QWidget *mouseGrabber;
  bool widgetInShow;
  QWidget *in_stack_00000098;
  QMouseEvent e;
  QPoint pos;
  QPoint windowPos;
  QPoint globalPos;
  undefined4 in_stack_fffffffffffffed8;
  KeyboardModifier in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QWidgetPrivate *in_stack_fffffffffffffee8;
  QWidget *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  byte bVar7;
  undefined1 local_d8 [24];
  undefined4 local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [6];
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  QPointer<QWidget> *in_stack_ffffffffffffff70;
  QWidget **in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  QMouseEvent *in_stack_ffffffffffffff88;
  QWidget *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI != (QWidget *)0x0) &&
     (bVar2 = QWidget::isWindow((QWidget *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)),
     !bVar2)) {
    bVar2 = QWidget::isVisible((QWidget *)0x2d05b9);
    bVar7 = 0;
    if (bVar2) {
      bVar7 = (*(uint *)&in_RSI->data->field_0x10 >> 0x12 & 1) != 0 ^ 0xff;
    }
    bVar3 = bVar7 & 1;
    if ((((bVar3 != 0) ||
         (bVar2 = ::operator!=((QWidget **)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                               (QPointer<QWidget> *)
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
         !bVar2)) &&
        ((bVar3 == 0 ||
         (pQVar4 = QWidget::parentWidget((QWidget *)0x2d062d),
         (*(uint *)&pQVar4->data->field_0x10 >> 10 & 1) == 0)))) &&
       ((((pQVar4 = QWidget::mouseGrabber(), pQVar4 == (QWidget *)0x0 || (pQVar4 == in_RSI)) &&
         (pQVar4 = QWidget::window(in_stack_fffffffffffffef0),
         (*(uint *)&pQVar4->data->field_0x10 >> 0x12 & 1) == 0)) &&
        ((*(uint *)&pQVar4->data->field_0x10 >> 9 & 1) == 0)))) {
      if (bVar3 != 0) {
        bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x2d06c2);
        if (!bVar2) goto LAB_002d0947;
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x2d06d4);
        pQVar5 = QWidget::window(in_stack_fffffffffffffef0);
        if (pQVar5 != pQVar4) goto LAB_002d0947;
      }
      QCursor::pos();
      QWidget::mapFromGlobal(in_stack_fffffffffffffef0,(QPoint *)in_stack_fffffffffffffee8);
      pos_00 = QWidget::d_func((QWidget *)0x2d0737);
      QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      pQVar5 = QWidgetPrivate::childAt_helper
                         (in_stack_fffffffffffffee8,
                          (QPointF *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          SUB41(in_stack_fffffffffffffedc >> 0x18,0));
      if (pQVar5 == (QWidget *)0x0) {
        pQVar5 = pQVar4;
      }
      QWidget::mapFrom(pQVar5,(QWidget *)CONCAT17(bVar7,in_stack_fffffffffffffef8),(QPoint *)pos_00)
      ;
      if (((bVar3 == 0) || (pQVar5 == in_RSI)) ||
         (bVar2 = QWidget::isAncestorOf
                            ((QWidget *)in_stack_fffffffffffffee8,
                             (QWidget *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)), bVar2))
      {
        if (((*(uint *)&in_RSI->data->field_0x10 >> 0x12 & 1) != 0) && (qt_button_down == in_RSI)) {
          qt_button_down = (QWidget *)0x0;
        }
        memset(&stack0xffffffffffffff78,0xaa,0x50);
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (QPoint *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QFlags<Qt::MouseButton>::QFlags
                  ((QFlags<Qt::MouseButton> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc);
        QFlags<Qt::KeyboardModifier>::QFlags
                  ((QFlags<Qt::KeyboardModifier> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffedc);
        QString::QString((QString *)0x2d08ab);
        pQVar6 = (QPointingDevice *)QPointingDevice::primaryPointingDevice((QString *)local_d8);
        QMouseEvent::QMouseEvent
                  ((QMouseEvent *)&stack0xffffffffffffff78,MouseMove,(QPointF *)local_98,
                   (QPointF *)local_a8,(QPointF *)local_b8,NoButton,
                   (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffedc,local_bc),
                   (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffee4,local_c0),pQVar6);
        QString::~QString((QString *)0x2d0901);
        sendMouseEvent(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_00000098,
                       in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                       ,(bool)in_stack_ffffffffffffff6f,(bool)in_stack_ffffffffffffff6e);
        QMouseEvent::~QMouseEvent((QMouseEvent *)&stack0xffffffffffffff78);
      }
    }
  }
LAB_002d0947:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::sendSyntheticEnterLeave(QWidget *widget)
{
#ifndef QT_NO_CURSOR
    if (!widget || widget->isWindow())
        return;
    const bool widgetInShow = widget->isVisible() && !widget->data->in_destructor;
    if (!widgetInShow && widget != qt_last_mouse_receiver)
        return; // Widget was not under the cursor when it was hidden/deleted.

    if (widgetInShow && widget->parentWidget()->data->in_show)
        return; // Ignore recursive show.

    QWidget *mouseGrabber = QWidget::mouseGrabber();
    if (mouseGrabber && mouseGrabber != widget)
        return; // Someone else has the grab; enter/leave should not occur.

    QWidget *tlw = widget->window();
    if (tlw->data->in_destructor || tlw->data->is_closing)
        return; // Closing down the business.

    if (widgetInShow && (!qt_last_mouse_receiver || qt_last_mouse_receiver->window() != tlw))
        return; // Mouse cursor not inside the widget's top-level.

    const QPoint globalPos(QCursor::pos());
    QPoint windowPos = tlw->mapFromGlobal(globalPos);

    // Find the current widget under the mouse. If this function was called from
    // the widget's destructor, we have to make sure childAt() doesn't take into
    // account widgets that are about to be destructed.
    QWidget *widgetUnderCursor = tlw->d_func()->childAt_helper(windowPos, widget->data->in_destructor);
    if (!widgetUnderCursor)
        widgetUnderCursor = tlw;
    QPoint pos = widgetUnderCursor->mapFrom(tlw, windowPos);

    if (widgetInShow && widgetUnderCursor != widget && !widget->isAncestorOf(widgetUnderCursor))
        return; // Mouse cursor not inside the widget or any of its children.

    if (widget->data->in_destructor && qt_button_down == widget)
        qt_button_down = nullptr;

    // A mouse move is not actually sent, but we utilize the sendMouseEvent() call to send the
    // enter/leave events as appropriate
    QMouseEvent e(QEvent::MouseMove, pos, windowPos, globalPos, Qt::NoButton, Qt::NoButton, Qt::NoModifier);
    sendMouseEvent(widgetUnderCursor, &e, widgetUnderCursor, tlw, &qt_button_down, qt_last_mouse_receiver, true, true);
#else // !QT_NO_CURSOR
    Q_UNUSED(widget);
#endif // QT_NO_CURSOR
}